

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse41_128_32.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_table_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int *piVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  ulong uVar7;
  bool bVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int32_t iVar16;
  int iVar17;
  parasail_result_t *ppVar18;
  __m128i *palVar19;
  __m128i *ptr;
  __m128i *ptr_00;
  int32_t *ptr_01;
  __m128i *palVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  ulong uVar24;
  __m128i *palVar25;
  uint uVar26;
  ulong size;
  ulong uVar27;
  int iVar28;
  uint uVar29;
  long lVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  uint uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  ulong uVar43;
  undefined1 auVar44 [16];
  uint uVar45;
  uint uVar47;
  uint uVar48;
  undefined1 auVar46 [16];
  uint uVar49;
  undefined1 auVar50 [16];
  int iVar51;
  int iVar57;
  int iVar58;
  undefined1 auVar52 [16];
  int iVar59;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar60;
  undefined1 in_XMM9 [16];
  undefined1 auVar61 [16];
  int iVar63;
  undefined1 auVar62 [16];
  uint uVar64;
  uint uVar67;
  uint uVar68;
  undefined1 in_XMM10 [16];
  undefined1 auVar65 [16];
  uint uVar69;
  undefined1 auVar66 [16];
  int iVar70;
  int iVar72;
  int iVar73;
  __m128i alVar71;
  int iVar74;
  undefined1 in_XMM12 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar77 [16];
  uint local_b8;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_table_striped_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar5 = (profile->profile32).score;
    if (pvVar5 == (void *)0x0) {
      parasail_sg_flags_table_striped_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_table_striped_profile_sse41_128_32_cold_6();
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          parasail_sg_flags_table_striped_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_table_striped_profile_sse41_128_32_cold_4();
        }
        else {
          uVar27 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sg_flags_table_striped_profile_sse41_128_32_cold_3();
          }
          else if (open < 0) {
            parasail_sg_flags_table_striped_profile_sse41_128_32_cold_2();
          }
          else if (gap < 0) {
            parasail_sg_flags_table_striped_profile_sse41_128_32_cold_1();
          }
          else {
            uVar34 = uVar3 - 1;
            uVar43 = (ulong)uVar3 + 3;
            size = uVar43 >> 2;
            uVar7 = (ulong)uVar34 % size;
            iVar12 = (int)(uVar34 / size);
            iVar28 = -open;
            iVar31 = ppVar6->min;
            uVar23 = 0x80000000 - iVar31;
            if (iVar31 != iVar28 && SBORROW4(iVar31,iVar28) == iVar31 + open < 0) {
              uVar23 = open | 0x80000000;
            }
            uVar13 = 0x7ffffffe - ppVar6->max;
            ppVar18 = parasail_result_new_table1((uint)uVar43 & 0x7ffffffc,s2Len);
            if (ppVar18 != (parasail_result_t *)0x0) {
              ppVar18->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar18->flag | 0x4420802;
              palVar19 = parasail_memalign___m128i(0x10,size);
              ptr = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
              if ((ptr_01 != (int32_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                  (ptr != (__m128i *)0x0 && palVar19 != (__m128i *)0x0)) {
                uVar14 = s2Len - 1;
                uVar15 = 3 - iVar12;
                uVar23 = uVar23 + 1;
                auVar41._4_4_ = uVar23;
                auVar41._0_4_ = uVar23;
                auVar41._8_4_ = uVar23;
                auVar41._12_4_ = uVar23;
                auVar46._4_4_ = iVar28;
                auVar46._0_4_ = iVar28;
                auVar46._8_4_ = iVar28;
                auVar46._12_4_ = iVar28;
                auVar50._0_8_ = CONCAT44(0,open);
                auVar50._8_4_ = open;
                auVar50._12_4_ = 0;
                uVar26 = (uint)size;
                auVar52._8_4_ = uVar26;
                auVar52._0_8_ = size;
                auVar52._12_4_ = 0;
                auVar61 = pmovsxbq(in_XMM9,0x302);
                auVar61 = pmuldq(auVar61,auVar52);
                auVar52 = pmuldq(auVar52,_DAT_00903a90);
                uVar24 = 0;
                auVar65 = pmovsxdq(in_XMM10,0x8000000080000000);
                palVar20 = ptr_00;
                palVar25 = palVar19;
                do {
                  if (s1_beg == 0) {
                    auVar77._8_4_ = (int)uVar24;
                    auVar77._0_8_ = uVar24;
                    auVar77._12_4_ = (int)(uVar24 >> 0x20);
                    auVar35._0_4_ = (undefined4)(uVar24 + auVar52._0_8_);
                    auVar35._4_4_ = (int)(auVar77._8_8_ + auVar52._8_8_);
                    auVar35._8_4_ = (int)(auVar61._0_8_ + uVar24);
                    auVar35._12_4_ = (int)(auVar61._8_8_ + auVar77._8_8_);
                    auVar75._4_4_ = gap;
                    auVar75._0_4_ = gap;
                    auVar75._8_4_ = gap;
                    auVar75._12_4_ = gap;
                    auVar75 = pmulld(auVar35,auVar75);
                    alVar71[0]._0_4_ = iVar28 - auVar75._0_4_;
                    alVar71[0]._4_4_ = iVar28 - auVar75._4_4_;
                    alVar71[1]._0_4_ = iVar28 - auVar75._8_4_;
                    alVar71[1]._4_4_ = iVar28 - auVar75._12_4_;
                  }
                  else {
                    alVar71[0] = 0;
                    alVar71[1] = 0;
                  }
                  auVar75 = pmovsxdq(in_XMM12,(undefined1  [16])alVar71);
                  auVar36._0_8_ = alVar71[1];
                  auVar36._8_4_ = (int)alVar71[1];
                  auVar36._12_4_ = alVar71[1]._4_4_;
                  auVar77 = pmovsxdq(in_XMM13,auVar36);
                  in_XMM13._0_8_ = auVar77._0_8_ - auVar50._0_8_;
                  in_XMM13._8_8_ = auVar77._8_8_ - (ulong)(uint)open;
                  auVar76._0_8_ = auVar75._0_8_ - auVar50._0_8_;
                  auVar76._8_8_ = auVar75._8_8_ - (ulong)(uint)open;
                  auVar37._0_8_ = -(ulong)(auVar65._0_8_ < auVar76._0_8_);
                  auVar37._8_8_ = -(ulong)(auVar65._8_8_ < auVar76._8_8_);
                  auVar75 = blendvpd(auVar65,auVar76,auVar37);
                  auVar38._0_8_ = -(ulong)(auVar65._0_8_ < in_XMM13._0_8_);
                  auVar38._8_8_ = -(ulong)(auVar65._8_8_ < in_XMM13._8_8_);
                  in_XMM12 = blendvpd(auVar65,in_XMM13,auVar38);
                  *palVar25 = alVar71;
                  *(int *)*palVar20 = auVar75._0_4_;
                  *(int *)((long)*palVar20 + 4) = auVar75._8_4_;
                  *(int *)(*palVar20 + 1) = in_XMM12._0_4_;
                  *(int *)((long)*palVar20 + 0xc) = in_XMM12._8_4_;
                  uVar24 = uVar24 + 1;
                  palVar20 = palVar20 + 1;
                  palVar25 = palVar25 + 1;
                } while (size != uVar24);
                *ptr_01 = 0;
                auVar52 = _DAT_00906ca0;
                lVar21 = uVar27 - 1;
                auVar61._8_4_ = (int)lVar21;
                auVar61._0_8_ = lVar21;
                auVar61._12_4_ = (int)((ulong)lVar21 >> 0x20);
                auVar46 = pmovsxbq(auVar46,0x302);
                auVar50 = pmovsxbq(auVar50,0x100);
                auVar61 = auVar61 ^ _DAT_00906ca0;
                uVar24 = 0;
                iVar31 = iVar28;
                do {
                  uVar9 = auVar52._0_8_;
                  lVar21 = auVar61._0_8_;
                  if ((bool)(~(lVar21 < (long)(uVar24 ^ uVar9)) & 1)) {
                    iVar16 = 0;
                    if (s2_beg == 0) {
                      iVar16 = iVar31;
                    }
                    ptr_01[uVar24 + 1] = iVar16;
                  }
                  auVar65._8_4_ = (int)uVar24;
                  auVar65._0_8_ = uVar24;
                  auVar65._12_4_ = (int)(uVar24 >> 0x20);
                  if ((long)((auVar65._8_8_ | auVar50._8_8_) ^ auVar52._8_8_) <= auVar61._8_8_) {
                    iVar17 = iVar31 - gap;
                    if (s2_beg != 0) {
                      iVar17 = 0;
                    }
                    ptr_01[uVar24 + 2] = iVar17;
                  }
                  bVar8 = (long)((uVar24 | auVar46._0_8_) ^ uVar9) <= lVar21;
                  if (bVar8) {
                    iVar17 = gap * -2 + iVar31;
                    if (s2_beg != 0) {
                      iVar17 = 0;
                    }
                    ptr_01[uVar24 + 3] = iVar17;
                  }
                  if (bVar8) {
                    iVar17 = gap * -3 + iVar31;
                    if (s2_beg != 0) {
                      iVar17 = 0;
                    }
                    ptr_01[uVar24 + 4] = iVar17;
                  }
                  uVar24 = uVar24 + 4;
                  iVar31 = iVar31 + gap * -4;
                } while ((s2Len + 3U & 0xfffffffc) != uVar24);
                lVar33 = size * uVar27;
                lVar21 = 0;
                auVar44._0_4_ = -(uint)(uVar15 == 3);
                auVar44._4_4_ = -(uint)(uVar15 == 2);
                auVar44._8_4_ = -(uint)(uVar15 == 1);
                auVar44._12_4_ = -(uint)(uVar15 == 0);
                uVar24 = 0;
                auVar39 = auVar41;
                auVar55 = auVar41;
                uVar45 = uVar13;
                uVar47 = uVar13;
                uVar48 = uVar13;
                uVar49 = uVar13;
                local_b8 = uVar14;
                do {
                  palVar20 = ptr;
                  ptr = palVar19;
                  iVar4 = ppVar6->mapper[(byte)s2[uVar24]];
                  palVar19 = ptr + (uVar26 - 1);
                  iVar31 = (int)(*palVar19)[0];
                  iVar17 = *(int *)((long)*palVar19 + 4);
                  iVar63 = (int)(*palVar19)[1];
                  iVar16 = ptr_01[uVar24];
                  lVar30 = 0;
                  lVar32 = lVar21;
                  auVar46 = auVar39;
                  auVar54 = auVar41;
                  do {
                    piVar1 = (int *)((long)pvVar5 + lVar30 + (long)iVar4 * size * 0x10);
                    iVar60 = iVar16 + *piVar1;
                    iVar31 = iVar31 + piVar1[1];
                    iVar17 = iVar17 + piVar1[2];
                    iVar63 = iVar63 + piVar1[3];
                    piVar1 = (int *)((long)*ptr_00 + lVar30);
                    iVar70 = *piVar1;
                    iVar72 = piVar1[1];
                    iVar73 = piVar1[2];
                    iVar74 = piVar1[3];
                    iVar51 = auVar54._0_4_;
                    uVar64 = (uint)(iVar70 < iVar51) * iVar51 | (uint)(iVar70 >= iVar51) * iVar70;
                    iVar57 = auVar54._4_4_;
                    uVar67 = (uint)(iVar72 < iVar57) * iVar57 | (uint)(iVar72 >= iVar57) * iVar72;
                    iVar58 = auVar54._8_4_;
                    uVar68 = (uint)(iVar73 < iVar58) * iVar58 | (uint)(iVar73 >= iVar58) * iVar73;
                    iVar59 = auVar54._12_4_;
                    uVar69 = (uint)(iVar74 < iVar59) * iVar59 | (uint)(iVar74 >= iVar59) * iVar74;
                    uVar64 = (uint)((int)uVar64 < iVar60) * iVar60 |
                             ((int)uVar64 >= iVar60) * uVar64;
                    uVar67 = (uint)((int)uVar67 < iVar31) * iVar31 |
                             ((int)uVar67 >= iVar31) * uVar67;
                    uVar68 = (uint)((int)uVar68 < iVar17) * iVar17 |
                             ((int)uVar68 >= iVar17) * uVar68;
                    uVar69 = (uint)((int)uVar69 < iVar63) * iVar63 |
                             ((int)uVar69 >= iVar63) * uVar69;
                    puVar2 = (uint *)((long)*palVar20 + lVar30);
                    *puVar2 = uVar64;
                    puVar2[1] = uVar67;
                    puVar2[2] = uVar68;
                    puVar2[3] = uVar69;
                    iVar31 = auVar46._0_4_;
                    auVar39._0_4_ =
                         (iVar31 < (int)uVar64) * uVar64 | (uint)(iVar31 >= (int)uVar64) * iVar31;
                    iVar31 = auVar46._4_4_;
                    auVar39._4_4_ =
                         (iVar31 < (int)uVar67) * uVar67 | (uint)(iVar31 >= (int)uVar67) * iVar31;
                    iVar31 = auVar46._8_4_;
                    iVar17 = auVar46._12_4_;
                    auVar39._8_4_ =
                         (iVar31 < (int)uVar68) * uVar68 | (uint)(iVar31 >= (int)uVar68) * iVar31;
                    auVar39._12_4_ =
                         (iVar17 < (int)uVar69) * uVar69 | (uint)(iVar17 >= (int)uVar69) * iVar17;
                    uVar45 = (uint)(iVar70 < (int)uVar45) * iVar70 |
                             (iVar70 >= (int)uVar45) * uVar45;
                    uVar47 = (uint)(iVar72 < (int)uVar47) * iVar72 |
                             (iVar72 >= (int)uVar47) * uVar47;
                    uVar48 = (uint)(iVar73 < (int)uVar48) * iVar73 |
                             (iVar73 >= (int)uVar48) * uVar48;
                    uVar49 = (uint)(iVar74 < (int)uVar49) * iVar74 |
                             (iVar74 >= (int)uVar49) * uVar49;
                    piVar1 = ((ppVar18->field_4).rowcols)->score_row;
                    *(uint *)((long)piVar1 + lVar32) = uVar64;
                    *(uint *)((long)piVar1 + lVar33 * 4 + lVar32) = uVar67;
                    *(uint *)((long)piVar1 + lVar33 * 8 + lVar32) = uVar68;
                    *(uint *)((long)piVar1 + lVar33 * 0xc + lVar32) = uVar69;
                    uVar45 = (uint)(iVar51 < (int)uVar45) * iVar51 |
                             (iVar51 >= (int)uVar45) * uVar45;
                    uVar47 = (uint)(iVar57 < (int)uVar47) * iVar57 |
                             (iVar57 >= (int)uVar47) * uVar47;
                    uVar48 = (uint)(iVar58 < (int)uVar48) * iVar58 |
                             (iVar58 >= (int)uVar48) * uVar48;
                    uVar49 = (uint)(iVar59 < (int)uVar49) * iVar59 |
                             (iVar59 >= (int)uVar49) * uVar49;
                    uVar45 = ((int)uVar64 < (int)uVar45) * uVar64 |
                             ((int)uVar64 >= (int)uVar45) * uVar45;
                    uVar47 = ((int)uVar67 < (int)uVar47) * uVar67 |
                             ((int)uVar67 >= (int)uVar47) * uVar47;
                    uVar48 = ((int)uVar68 < (int)uVar48) * uVar68 |
                             ((int)uVar68 >= (int)uVar48) * uVar48;
                    uVar49 = ((int)uVar69 < (int)uVar49) * uVar69 |
                             ((int)uVar69 >= (int)uVar49) * uVar49;
                    iVar31 = uVar64 - open;
                    iVar17 = uVar67 - open;
                    iVar63 = uVar68 - open;
                    iVar60 = uVar69 - open;
                    iVar70 = iVar70 - gap;
                    iVar72 = iVar72 - gap;
                    iVar73 = iVar73 - gap;
                    iVar74 = iVar74 - gap;
                    puVar2 = (uint *)((long)*ptr_00 + lVar30);
                    *puVar2 = (uint)(iVar70 < iVar31) * iVar31 | (uint)(iVar70 >= iVar31) * iVar70;
                    puVar2[1] = (uint)(iVar72 < iVar17) * iVar17 | (uint)(iVar72 >= iVar17) * iVar72
                    ;
                    puVar2[2] = (uint)(iVar73 < iVar63) * iVar63 | (uint)(iVar73 >= iVar63) * iVar73
                    ;
                    puVar2[3] = (uint)(iVar74 < iVar60) * iVar60 | (uint)(iVar74 >= iVar60) * iVar74
                    ;
                    iVar51 = iVar51 - gap;
                    iVar57 = iVar57 - gap;
                    iVar58 = iVar58 - gap;
                    iVar59 = iVar59 - gap;
                    auVar54._0_4_ =
                         (uint)(iVar51 < iVar31) * iVar31 | (uint)(iVar51 >= iVar31) * iVar51;
                    auVar54._4_4_ =
                         (uint)(iVar57 < iVar17) * iVar17 | (uint)(iVar57 >= iVar17) * iVar57;
                    auVar54._8_4_ =
                         (uint)(iVar58 < iVar63) * iVar63 | (uint)(iVar58 >= iVar63) * iVar58;
                    auVar54._12_4_ =
                         (uint)(iVar59 < iVar60) * iVar60 | (uint)(iVar59 >= iVar60) * iVar59;
                    piVar1 = (int *)((long)*ptr + lVar30);
                    iVar16 = *piVar1;
                    iVar31 = piVar1[1];
                    iVar17 = piVar1[2];
                    iVar63 = piVar1[3];
                    lVar30 = lVar30 + 0x10;
                    lVar32 = lVar32 + uVar27 * 4;
                    auVar46 = auVar39;
                  } while (size << 4 != lVar30);
                  iVar31 = 0;
                  do {
                    iVar17 = iVar28;
                    if (s2_beg == 0) {
                      iVar17 = ptr_01[uVar24 + 1] - open;
                    }
                    auVar53._0_4_ = auVar54._0_4_;
                    auVar53._4_4_ = auVar53._0_4_;
                    auVar53._8_4_ = auVar54._4_4_;
                    auVar53._12_4_ = auVar54._8_4_;
                    auVar54._4_4_ = auVar53._0_4_;
                    auVar54._0_4_ = iVar17;
                    auVar54._8_8_ = auVar53._8_8_;
                    lVar30 = 0;
                    lVar32 = lVar21;
                    auVar46 = auVar39;
                    do {
                      piVar1 = (int *)((long)*palVar20 + lVar30);
                      iVar63 = *piVar1;
                      iVar4 = piVar1[1];
                      iVar51 = piVar1[2];
                      iVar57 = piVar1[3];
                      iVar17 = auVar54._0_4_;
                      uVar64 = (uint)(iVar63 < iVar17) * iVar17 | (uint)(iVar63 >= iVar17) * iVar63;
                      iVar63 = auVar54._4_4_;
                      uVar67 = (uint)(iVar4 < iVar63) * iVar63 | (uint)(iVar4 >= iVar63) * iVar4;
                      iVar4 = auVar54._8_4_;
                      uVar68 = (uint)(iVar51 < iVar4) * iVar4 | (uint)(iVar51 >= iVar4) * iVar51;
                      iVar51 = auVar54._12_4_;
                      uVar69 = (uint)(iVar57 < iVar51) * iVar51 | (uint)(iVar57 >= iVar51) * iVar57;
                      puVar2 = (uint *)((long)*palVar20 + lVar30);
                      *puVar2 = uVar64;
                      puVar2[1] = uVar67;
                      puVar2[2] = uVar68;
                      puVar2[3] = uVar69;
                      piVar1 = ((ppVar18->field_4).rowcols)->score_row;
                      *(uint *)((long)piVar1 + lVar32) = uVar64;
                      lVar22 = (long)piVar1 + lVar32;
                      *(uint *)(lVar33 * 4 + lVar22) = uVar67;
                      *(uint *)(lVar33 * 8 + lVar22) = uVar68;
                      *(uint *)(lVar33 * 0xc + lVar22) = uVar69;
                      uVar45 = ((int)uVar64 < (int)uVar45) * uVar64 |
                               ((int)uVar64 >= (int)uVar45) * uVar45;
                      uVar47 = ((int)uVar67 < (int)uVar47) * uVar67 |
                               ((int)uVar67 >= (int)uVar47) * uVar47;
                      uVar48 = ((int)uVar68 < (int)uVar48) * uVar68 |
                               ((int)uVar68 >= (int)uVar48) * uVar48;
                      uVar49 = ((int)uVar69 < (int)uVar49) * uVar69 |
                               ((int)uVar69 >= (int)uVar49) * uVar49;
                      iVar57 = auVar46._0_4_;
                      auVar39._0_4_ =
                           (iVar57 < (int)uVar64) * uVar64 | (uint)(iVar57 >= (int)uVar64) * iVar57;
                      iVar57 = auVar46._4_4_;
                      auVar39._4_4_ =
                           (iVar57 < (int)uVar67) * uVar67 | (uint)(iVar57 >= (int)uVar67) * iVar57;
                      iVar57 = auVar46._8_4_;
                      iVar58 = auVar46._12_4_;
                      auVar39._8_4_ =
                           (iVar57 < (int)uVar68) * uVar68 | (uint)(iVar57 >= (int)uVar68) * iVar57;
                      auVar39._12_4_ =
                           (iVar58 < (int)uVar69) * uVar69 | (uint)(iVar58 >= (int)uVar69) * iVar58;
                      auVar54._0_4_ = iVar17 - gap;
                      auVar54._4_4_ = iVar63 - gap;
                      auVar54._8_4_ = iVar4 - gap;
                      auVar54._12_4_ = iVar51 - gap;
                      auVar66._0_4_ = -(uint)((int)(uVar64 - open) < (int)auVar54._0_4_);
                      auVar66._4_4_ = -(uint)((int)(uVar67 - open) < (int)auVar54._4_4_);
                      auVar66._8_4_ = -(uint)((int)(uVar68 - open) < (int)auVar54._8_4_);
                      auVar66._12_4_ = -(uint)((int)(uVar69 - open) < (int)auVar54._12_4_);
                      iVar17 = movmskps((int)lVar22,auVar66);
                      if (iVar17 == 0) goto LAB_006c5d74;
                      lVar30 = lVar30 + 0x10;
                      lVar32 = lVar32 + uVar27 * 4;
                      auVar46 = auVar39;
                    } while (size << 4 != lVar30);
                    iVar31 = iVar31 + 1;
                  } while (iVar31 != 4);
LAB_006c5d74:
                  palVar19 = palVar20 + uVar7;
                  iVar31 = (int)(*palVar19)[0];
                  iVar17 = *(int *)((long)*palVar19 + 4);
                  iVar63 = (int)(*palVar19)[1];
                  iVar4 = *(int *)((long)*palVar19 + 0xc);
                  iVar51 = auVar55._0_4_;
                  auVar62._0_4_ = -(uint)(iVar51 < iVar31);
                  iVar57 = auVar55._4_4_;
                  auVar62._4_4_ = -(uint)(iVar57 < iVar17);
                  iVar58 = auVar55._8_4_;
                  auVar62._8_4_ = -(uint)(iVar58 < iVar63);
                  iVar59 = auVar55._12_4_;
                  auVar62._12_4_ = -(uint)(iVar59 < iVar4);
                  auVar55._0_4_ =
                       (uint)(iVar31 < iVar51) * iVar51 | (uint)(iVar31 >= iVar51) * iVar31;
                  auVar55._4_4_ =
                       (uint)(iVar17 < iVar57) * iVar57 | (uint)(iVar17 >= iVar57) * iVar17;
                  auVar55._8_4_ =
                       (uint)(iVar63 < iVar58) * iVar58 | (uint)(iVar63 >= iVar58) * iVar63;
                  auVar55._12_4_ = (uint)(iVar4 < iVar59) * iVar59 | (uint)(iVar4 >= iVar59) * iVar4
                  ;
                  iVar31 = movmskps((int)uVar7 * 0x10,auVar62 & auVar44);
                  if (iVar31 != 0) {
                    local_b8 = (uint)uVar24;
                  }
                  uVar24 = uVar24 + 1;
                  lVar21 = lVar21 + 4;
                  palVar19 = palVar20;
                  if (uVar24 == uVar27) {
                    uVar64 = uVar23;
                    uVar67 = local_b8;
                    if ((s2_end != 0) && (uVar64 = auVar55._12_4_, iVar12 < 3)) {
                      iVar31 = 0;
                      do {
                        auVar56._0_8_ = auVar55._0_8_ << 0x20;
                        auVar56._8_8_ = auVar55._8_8_ << 0x20 | auVar55._0_8_ >> 0x20;
                        uVar64 = auVar55._8_4_;
                        iVar31 = iVar31 + 1;
                        auVar55 = auVar56;
                        uVar67 = uVar15;
                      } while (iVar31 < (int)uVar15);
                    }
                    uVar68 = uVar34;
                    if ((s1_end != 0) && ((uVar43 & 0x7ffffffc) != 0)) {
                      uVar27 = 0;
                      do {
                        uVar67 = (uint)(uVar27 >> 2) & 0x3fffffff;
                        uVar29 = ((uint)uVar27 & 3) * uVar26 + uVar67;
                        uVar69 = uVar64;
                        uVar10 = uVar68;
                        uVar11 = local_b8;
                        if (((int)uVar29 < (int)uVar3) &&
                           (uVar69 = *(uint *)((long)*palVar20 + uVar27 * 4), uVar10 = uVar29,
                           uVar67 = uVar14, uVar11 = uVar14, (int)uVar69 <= (int)uVar64)) {
                          if ((int)uVar68 <= (int)uVar29) {
                            uVar29 = uVar68;
                          }
                          uVar67 = local_b8 ^ uVar14 | uVar69 ^ uVar64;
                          uVar69 = uVar64;
                          uVar10 = uVar68;
                          uVar11 = local_b8;
                          if (uVar67 == 0) {
                            uVar10 = uVar29;
                          }
                        }
                        local_b8 = uVar11;
                        uVar68 = uVar10;
                        uVar64 = uVar69;
                        uVar27 = uVar27 + 1;
                      } while ((uVar26 & 0x1fffffff) << 2 != (int)uVar27);
                    }
                    if (s2_end == 0 && s1_end == 0) {
                      uVar27 = palVar20[uVar7][1];
                      if (iVar12 < 3) {
                        iVar31 = 0;
                        uVar43 = palVar20[uVar7][0];
                        do {
                          uVar27 = uVar27 << 0x20 | uVar43 >> 0x20;
                          iVar31 = iVar31 + 1;
                          uVar43 = uVar43 << 0x20;
                        } while (iVar31 < (int)uVar15);
                      }
                      uVar64 = (uint)(uVar27 >> 0x20);
                      uVar68 = uVar34;
                      uVar67 = uVar14;
                      local_b8 = uVar14;
                    }
                    auVar42._0_4_ = -(uint)((int)uVar45 < (int)uVar23);
                    auVar42._4_4_ = -(uint)((int)uVar47 < (int)uVar23);
                    auVar42._8_4_ = -(uint)((int)uVar48 < (int)uVar23);
                    auVar42._12_4_ = -(uint)((int)uVar49 < (int)uVar23);
                    auVar40._0_4_ = -(uint)((int)uVar13 < (int)auVar39._0_4_);
                    auVar40._4_4_ = -(uint)((int)uVar13 < (int)auVar39._4_4_);
                    auVar40._8_4_ = -(uint)((int)uVar13 < (int)auVar39._8_4_);
                    auVar40._12_4_ = -(uint)((int)uVar13 < (int)auVar39._12_4_);
                    iVar31 = movmskps(uVar67,auVar40 | auVar42);
                    if (iVar31 != 0) {
                      *(byte *)&ppVar18->flag = (byte)ppVar18->flag | 0x40;
                      uVar64 = 0;
                      local_b8 = 0;
                      uVar68 = 0;
                    }
                    ppVar18->score = uVar64;
                    ppVar18->end_query = uVar68;
                    ppVar18->end_ref = local_b8;
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(palVar20);
                    return ppVar18;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi32(_mm_set1_epi32(position),
            _mm_set_epi32(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 4);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi32(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi32(vH, vE);
            vH = _mm_max_epi32(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vF = _mm_slli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi32(vH, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm_max_epi32(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi32(vH, vMaxH));
            vMaxH = _mm_max_epi32(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 4);
        }
        score = (int32_t) _mm_extract_epi32(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            score = (int32_t) _mm_extract_epi32 (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}